

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetGlobalGenerator(cmake *this,cmGlobalGenerator *gg)

{
  bool bVar1;
  ulong uVar2;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string env;
  allocator<char> local_39;
  string local_38;
  cmGlobalGenerator *local_18;
  cmGlobalGenerator *gg_local;
  cmake *this_local;
  
  local_18 = gg;
  gg_local = (cmGlobalGenerator *)this;
  if (gg == (cmGlobalGenerator *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Error SetGlobalGenerator called with null",&local_39);
    cmSystemTools::Error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"CC=",&local_71);
      std::allocator<char>::~allocator(&local_71);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_70,(string *)&this->CCEnvironment);
      }
      cmsys::SystemTools::PutEnv((string *)local_70);
      std::__cxx11::string::operator=((string *)local_70,"CXX=");
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_70,(string *)&this->CXXEnvironment);
      }
      cmsys::SystemTools::PutEnv((string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
    }
    this->GlobalGenerator = local_18;
    bVar1 = cmGlobalGenerator::GetForceUnixPaths(this->GlobalGenerator);
    cmSystemTools::SetForceUnixPaths(bVar1);
    bVar1 = cmsys::SystemTools::GetEnv("CXX",&this->CXXEnvironment);
    if (!bVar1) {
      std::__cxx11::string::clear();
    }
    bVar1 = cmsys::SystemTools::GetEnv("CC",&this->CCEnvironment);
    if (!bVar1) {
      std::__cxx11::string::clear();
    }
  }
  return;
}

Assistant:

void cmake::SetGlobalGenerator(cmGlobalGenerator* gg)
{
  if (!gg) {
    cmSystemTools::Error("Error SetGlobalGenerator called with null");
    return;
  }
  // delete the old generator
  if (this->GlobalGenerator) {
    delete this->GlobalGenerator;
    // restore the original environment variables CXX and CC
    // Restore CC
    std::string env = "CC=";
    if (!this->CCEnvironment.empty()) {
      env += this->CCEnvironment;
    }
    cmSystemTools::PutEnv(env);
    env = "CXX=";
    if (!this->CXXEnvironment.empty()) {
      env += this->CXXEnvironment;
    }
    cmSystemTools::PutEnv(env);
  }

  // set the new
  this->GlobalGenerator = gg;

  // set the global flag for unix style paths on cmSystemTools as soon as
  // the generator is set.  This allows gmake to be used on windows.
  cmSystemTools::SetForceUnixPaths(this->GlobalGenerator->GetForceUnixPaths());

  // Save the environment variables CXX and CC
  if (!cmSystemTools::GetEnv("CXX", this->CXXEnvironment)) {
    this->CXXEnvironment.clear();
  }
  if (!cmSystemTools::GetEnv("CC", this->CCEnvironment)) {
    this->CCEnvironment.clear();
  }
}